

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O2

void PWM_Update(void *info,UINT32 length,DEV_SMPL **buf)

{
  DEV_SMPL DVar1;
  DEV_SMPL DVar2;
  ulong uVar3;
  
  if (*(char *)((long)info + 0xd) != '\0') {
    memset(*buf,0,(ulong)length << 2);
    memset(buf[1],0,(ulong)length << 2);
    return;
  }
  DVar1 = PWM_Update_Scale((pwm_chip *)info,*(INT16 *)((long)info + 0x10));
  DVar2 = PWM_Update_Scale((pwm_chip *)info,*(INT16 *)((long)info + 0xe));
  for (uVar3 = 0; length != uVar3; uVar3 = uVar3 + 1) {
    (*buf)[uVar3] = DVar1;
    buf[1][uVar3] = DVar2;
  }
  return;
}

Assistant:

static void PWM_Update(void* info, UINT32 length, DEV_SMPL **buf)
{
	pwm_chip* chip = (pwm_chip*)info;
	DEV_SMPL tmpOutL;
	DEV_SMPL tmpOutR;
	UINT32 i;
	
	if (chip->PWM_Mute)
	{
		memset(buf[0], 0, length * sizeof(DEV_SMPL));
		memset(buf[1], 0, length * sizeof(DEV_SMPL));
		return;
	}
	
	// New PWM scaling algorithm provided by Chilly Willy on the Sonic Retro forums.
	tmpOutL = PWM_Update_Scale(chip, (INT16)chip->PWM_Out_L);
	tmpOutR = PWM_Update_Scale(chip, (INT16)chip->PWM_Out_R);
	
	for (i = 0; i < length; i ++)
	{
		buf[0][i] = tmpOutL;
		buf[1][i] = tmpOutR;
	}
	
	return;
}